

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObjectPropertyEnumerator.cpp
# Opt level: O0

JavascriptString * __thiscall
Js::DynamicObjectPropertyEnumerator::MoveAndGetNext
          (DynamicObjectPropertyEnumerator *this,PropertyId *propertyId,
          PropertyAttributes *attributes)

{
  DynamicType *pDVar1;
  CachedData **ppCVar2;
  DynamicType **ppDVar3;
  DynamicObject *this_00;
  DynamicType *pDVar4;
  JavascriptString *pJVar5;
  DynamicObject **ppDVar6;
  nullptr_t local_30;
  PropertyAttributes *local_28;
  PropertyAttributes *attributes_local;
  PropertyId *propertyId_local;
  DynamicObjectPropertyEnumerator *this_local;
  
  *propertyId = -1;
  local_28 = attributes;
  attributes_local = (PropertyAttributes *)propertyId;
  propertyId_local = (PropertyId *)this;
  ppCVar2 = Memory::WriteBarrierPtr::operator_cast_to_CachedData__
                      ((WriteBarrierPtr *)&this->cachedData);
  if (*ppCVar2 != (CachedData *)0x0) {
    ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                        ((WriteBarrierPtr *)&this->initialType);
    pDVar1 = *ppDVar3;
    this_00 = Memory::WriteBarrierPtr<Js::DynamicObject>::operator->(&this->object);
    pDVar4 = DynamicObject::GetDynamicType(this_00);
    if (pDVar1 == pDVar4) {
      pJVar5 = MoveAndGetNextWithCache(this,(PropertyId *)attributes_local,local_28);
      return pJVar5;
    }
  }
  ppDVar6 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&this->object);
  if (*ppDVar6 == (DynamicObject *)0x0) {
    this_local = (DynamicObjectPropertyEnumerator *)0x0;
  }
  else {
    local_30 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::DynamicObjectPropertyEnumerator::CachedData>::operator=
              (&this->cachedData,&local_30);
    this_local = (DynamicObjectPropertyEnumerator *)
                 MoveAndGetNextNoCache(this,(PropertyId *)attributes_local,local_28);
  }
  return (JavascriptString *)this_local;
}

Assistant:

JavascriptString * DynamicObjectPropertyEnumerator::MoveAndGetNext(PropertyId& propertyId, PropertyAttributes * attributes)
    {
        propertyId = Js::Constants::NoProperty;
        if (this->cachedData && this->initialType == this->object->GetDynamicType())
        {
            return MoveAndGetNextWithCache(propertyId, attributes);
        }
        if (this->object)
        {
            // Once enters NoCache path, ensure never switches to Cache path above.
            this->cachedData = nullptr;
            return MoveAndGetNextNoCache(propertyId, attributes);
        }
        return nullptr;
    }